

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O2

Reals __thiscall
Omega_h::coarsen_qualities(Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  Omega_h_Parting OVar1;
  LO nmetrics;
  uint uVar2;
  Int IVar3;
  void *extraout_RDX;
  Write<int> *this_00;
  Reals RVar4;
  LOs edges2verts;
  Write<int> local_138;
  Write<int> local_128;
  Write<int> local_118;
  Write<int> local_108;
  Write<int> cands2verts;
  Write<signed_char> local_e8;
  Write<int> local_d8;
  Write<signed_char> local_c8;
  Write<int> local_b8;
  Write<signed_char> local_a8;
  Write<int> local_98;
  Write<signed_char> local_88;
  Write<int> local_78;
  Write<double> local_68;
  Read<double> metrics;
  Write<double> local_48 [2];
  
  this_00 = &edges2verts.write_;
  OVar1 = Mesh::parting(mesh);
  if (OVar1 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
         ,0x42);
  }
  std::__cxx11::string::string((string *)local_48,"metric",(allocator *)&edges2verts);
  Mesh::get_array<double>((Mesh *)&metrics,(Int)mesh,(string *)0x0);
  std::__cxx11::string::~string((string *)local_48);
  nmetrics = Mesh::nverts(mesh);
  Write<double>::Write(&local_68,&metrics.write_);
  uVar2 = get_metrics_dim(nmetrics,(Reals *)&local_68);
  Write<double>::~Write(&local_68);
  local_48[0].shared_alloc_.alloc = (Alloc *)0x0;
  local_48[0].shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  IVar3 = Mesh::dim(mesh);
  if (uVar2 == 3 && IVar3 == 3) {
    Write<int>::Write(&local_78,&cands2edges->write_);
    Write<signed_char>::Write(&local_88,&cand_codes->write_);
    coarsen_qualities_tmpl<3,3>(this,mesh,(LOs *)&local_78,(Read<signed_char> *)&local_88);
    Write<signed_char>::~Write(&local_88);
    this_00 = &local_78;
  }
  else {
    IVar3 = Mesh::dim(mesh);
    if (uVar2 == 2 && IVar3 == 2) {
      Write<int>::Write(&local_98,&cands2edges->write_);
      Write<signed_char>::Write(&local_a8,&cand_codes->write_);
      coarsen_qualities_tmpl<2,2>(this,mesh,(LOs *)&local_98,(Read<signed_char> *)&local_a8);
      Write<signed_char>::~Write(&local_a8);
      this_00 = &local_98;
    }
    else {
      IVar3 = Mesh::dim(mesh);
      if (IVar3 == 3 && (uVar2 ^ 1) == 0) {
        Write<int>::Write(&local_b8,&cands2edges->write_);
        Write<signed_char>::Write(&local_c8,&cand_codes->write_);
        coarsen_qualities_tmpl<3,1>(this,mesh,(LOs *)&local_b8,(Read<signed_char> *)&local_c8);
        Write<signed_char>::~Write(&local_c8);
        this_00 = &local_b8;
      }
      else {
        IVar3 = Mesh::dim(mesh);
        if ((uVar2 ^ 1) == 0 && IVar3 == 2) {
          Write<int>::Write(&local_d8,&cands2edges->write_);
          Write<signed_char>::Write(&local_e8,&cand_codes->write_);
          coarsen_qualities_tmpl<2,1>(this,mesh,(LOs *)&local_d8,(Read<signed_char> *)&local_e8);
          Write<signed_char>::~Write(&local_e8);
          this_00 = &local_d8;
        }
        else {
          IVar3 = Mesh::dim(mesh);
          if (IVar3 != 1) {
            fail("assertion %s failed at %s +%d\n","false",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
                 ,0x57);
          }
          Mesh::ask_verts_of((Mesh *)&edges2verts,(Int)mesh);
          Write<int>::Write(&local_108,&cands2edges->write_);
          Write<int>::Write(&local_118,&edges2verts.write_);
          unmap<int>((Omega_h *)&cands2verts,(LOs *)&local_108,(Read<int> *)&local_118,2);
          Write<int>::~Write(&local_118);
          Write<int>::~Write(&local_108);
          Write<int>::Write(&local_138,&cands2verts);
          Read<int>::Read((Read<signed_char> *)&local_128,&local_138);
          get_1d_cavity_qualities(this,mesh,0,(LOs *)&local_128);
          Write<int>::~Write(&local_128);
          Write<int>::~Write(&local_138);
          Write<int>::~Write(&cands2verts);
        }
      }
    }
  }
  Write<int>::~Write(this_00);
  Write<double>::~Write(local_48);
  Write<double>::~Write(&metrics.write_);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals coarsen_qualities(Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto metrics = mesh->get_array<Real>(VERT, "metric");
  auto metric_dim = get_metrics_dim(mesh->nverts(), metrics);
  auto cand_quals = Reals();
  if (mesh->dim() == 3 && metric_dim == 3) {
    return coarsen_qualities_tmpl<3, 3>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 2) {
    return coarsen_qualities_tmpl<2, 2>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 3 && metric_dim == 1) {
    return coarsen_qualities_tmpl<3, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 1) {
    return coarsen_qualities_tmpl<2, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 1) {
    auto edges2verts = mesh->ask_verts_of(EDGE);
    auto cands2verts = unmap(cands2edges, edges2verts, 2);
    return get_1d_cavity_qualities(mesh, VERT, cands2verts);
  }
  OMEGA_H_NORETURN(Reals());
}